

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void ARGBShuffleRow_C(uint8_t *src_argb,uint8_t *dst_argb,uint8_t *shuffler,int width)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  long lVar8;
  
  bVar1 = *shuffler;
  bVar2 = shuffler[1];
  bVar3 = shuffler[2];
  bVar4 = shuffler[3];
  lVar8 = 0;
  if (width < 1) {
    width = 0;
  }
  for (; width != (int)lVar8; lVar8 = lVar8 + 1) {
    uVar5 = src_argb[lVar8 * 4 + (ulong)bVar2];
    uVar6 = src_argb[lVar8 * 4 + (ulong)bVar3];
    uVar7 = src_argb[lVar8 * 4 + (ulong)bVar4];
    dst_argb[lVar8 * 4] = src_argb[lVar8 * 4 + (ulong)bVar1];
    dst_argb[lVar8 * 4 + 1] = uVar5;
    dst_argb[lVar8 * 4 + 2] = uVar6;
    dst_argb[lVar8 * 4 + 3] = uVar7;
  }
  return;
}

Assistant:

void ARGBShuffleRow_C(const uint8_t* src_argb,
                      uint8_t* dst_argb,
                      const uint8_t* shuffler,
                      int width) {
  int index0 = shuffler[0];
  int index1 = shuffler[1];
  int index2 = shuffler[2];
  int index3 = shuffler[3];
  // Shuffle a row of ARGB.
  int x;
  for (x = 0; x < width; ++x) {
    // To support in-place conversion.
    uint8_t b = src_argb[index0];
    uint8_t g = src_argb[index1];
    uint8_t r = src_argb[index2];
    uint8_t a = src_argb[index3];
    dst_argb[0] = b;
    dst_argb[1] = g;
    dst_argb[2] = r;
    dst_argb[3] = a;
    src_argb += 4;
    dst_argb += 4;
  }
}